

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O2

bool TestDigitalInputs(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile,uint qlaNum)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  ostream *poVar4;
  char *pcVar5;
  uint8_t mask;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  bool local_9c;
  char buf [80];
  
  poVar4 = std::endl<char,std::char_traits<char>>((ostream *)logFile);
  poVar4 = std::operator<<(poVar4,"=== DIGITAL INPUTS ===");
  std::endl<char,std::char_traits<char>>(poVar4);
  Amp1394Console::Print
            (curLine,9,
             "This tests the loopback on the test board between DOUT4 and all digital inputs");
  bVar8 = qlaNum == 2;
  mask = '\b';
  if (bVar8) {
    mask = 0x80;
  }
  uVar7 = 0xfff;
  if (bVar8) {
    uVar7 = 0xfff0000;
  }
  std::operator<<((ostream *)logFile,"   All inputs low: ");
  bVar1 = AmpIO::WriteDigitalOutput(Board,mask,'\0');
  if (bVar1) {
    Amp1394_Sleep(0.001);
    iVar2 = (*Port->_vptr_BasePort[0x1d])(Port);
    if ((char)iVar2 == '\0') {
      builtin_strncpy(buf + 10,"read fr",7);
      builtin_strncpy(buf + 0x12,"m board",8);
      pcVar5 = " - Failed to read from board";
      goto LAB_00105cef;
    }
    uVar3 = AmpIO::GetDigitalInput(Board);
    uVar6 = (uVar3 & uVar7) >> (bVar8 << 4);
    *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
         *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)logFile);
    local_9c = uVar6 == 0;
    if (local_9c) {
      sprintf(buf,"Setting all inputs low - PASS (%03lx)",0);
      pcVar5 = " - PASS";
    }
    else {
      sprintf(buf,"Setting all inputs low - FAIL (%03lx)",(ulong)uVar6);
      pcVar5 = " - FAIL";
    }
  }
  else {
    builtin_strncpy(buf + 10,"write t",7);
    builtin_strncpy(buf + 0x12," board",7);
    pcVar5 = " - Failed to write to board";
LAB_00105cef:
    buf[0x11] = 'o';
    builtin_strncpy(buf,"Failed to ",10);
    local_9c = false;
  }
  poVar4 = std::operator<<((ostream *)logFile,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  Amp1394Console::Print(curLine + 1,9,buf);
  std::operator<<((ostream *)logFile,"   All inputs high: ");
  bVar1 = AmpIO::WriteDigitalOutput(Board,mask,mask);
  if (bVar1) {
    Amp1394_Sleep(0.001);
    iVar2 = (*Port->_vptr_BasePort[0x1d])(Port);
    if ((char)iVar2 != '\0') {
      uVar3 = AmpIO::GetDigitalInput(Board);
      uVar7 = (uVar3 & uVar7) >> (bVar8 << 4);
      *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
           *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)logFile);
      if (uVar7 == 0xfff) {
        sprintf(buf,"Setting all inputs high - PASS (%03lx)",0xfff);
        pcVar5 = " - PASS";
      }
      else {
        local_9c = false;
        sprintf(buf,"Setting all inputs high - FAIL (%03lx)",(ulong)uVar7);
        pcVar5 = " - FAIL";
      }
      goto LAB_00105e35;
    }
    builtin_strncpy(buf + 10,"read fr",7);
    builtin_strncpy(buf + 0x12,"m board",8);
    pcVar5 = " - Failed to read from board";
  }
  else {
    builtin_strncpy(buf + 10,"write t",7);
    builtin_strncpy(buf + 0x12," board",7);
    pcVar5 = " - Failed to write to board";
  }
  buf[0x11] = 'o';
  builtin_strncpy(buf,"Failed to ",10);
  local_9c = false;
LAB_00105e35:
  poVar4 = std::operator<<((ostream *)logFile,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  Amp1394Console::Print(curLine + 2,9,buf);
  return local_9c;
}

Assistant:

bool TestDigitalInputs(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile, unsigned int qlaNum)
{
    bool pass = true;
    unsigned long data;
    char buf[80];

    logFile << std::endl << "=== DIGITAL INPUTS ===" << std::endl;
    Amp1394Console::Print(curLine++, 9, "This tests the loopback on the test board"
                           " between DOUT4 and all digital inputs");

    uint8_t dout4_mask = (qlaNum == 2) ? 0x80 : 0x08;
    uint32_t data_mask = (qlaNum == 2) ? 0x0fff0000 : 0x00000fff;
    int data_shift = (qlaNum == 2) ? 16 : 0;

    logFile << "   All inputs low: ";
    if (Board.WriteDigitalOutput(dout4_mask, 0x00)) {

        Amp1394_Sleep(0.001);
        if (Port->ReadAllBoards()) {
            data = (Board.GetDigitalInput() & data_mask) >> data_shift;
            logFile << std::hex << data;
            if (!data) {
                sprintf(buf, "Setting all inputs low - PASS (%03lx)", data);
                logFile << " - PASS" << std::endl;
            }
            else {
                sprintf(buf, "Setting all inputs low - FAIL (%03lx)", data);
                logFile << " - FAIL" << std::endl;
                pass = false;
            }
        }
        else {
            strcpy(buf, "Failed to read from board");
            logFile << " - Failed to read from board" << std::endl;
            pass = false;
        }
    }
    else {
        strcpy(buf, "Failed to write to board");
        logFile << " - Failed to write to board" << std::endl;
        pass = false;
    }

    Amp1394Console::Print(curLine++, 9, buf);
    logFile << "   All inputs high: ";
    if (Board.WriteDigitalOutput(dout4_mask, dout4_mask)) {

        Amp1394_Sleep(0.001);
        if (Port->ReadAllBoards()) {
            data = (Board.GetDigitalInput() & data_mask) >> data_shift;
            logFile << std::hex << data;
            if (data == 0x0fff) {
                sprintf(buf, "Setting all inputs high - PASS (%03lx)", data);
                logFile << " - PASS" << std::endl;
            }
            else {
                sprintf(buf, "Setting all inputs high - FAIL (%03lx)", data);
                logFile << " - FAIL" << std::endl;
                pass = false;
            }
        }
        else {
            strcpy(buf, "Failed to read from board");
            logFile << " - Failed to read from board" << std::endl;
            pass = false;
        }
    }
    else {
        strcpy(buf, "Failed to write to board");
        logFile << " - Failed to write to board" << std::endl;
        pass = false;
    }

    Amp1394Console::Print(curLine++, 9, buf);
    return pass;
}